

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O0

DisasJumpType op_vstm(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx_00;
  TCGv_i64 pTVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  TCGv_i64 arg3;
  TCGv_i64 tmp;
  uint8_t v1;
  uint8_t v3;
  TCGContext_conflict12 *tcg_ctx;
  DisasOps *o_local;
  DisasContext_conflict13 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar3 = get_field1(s,FLD_O_v3,FLD_C_i3);
  uVar4 = get_field1(s,FLD_O_v1,FLD_C_b1);
  tmp._6_1_ = (uint8_t)uVar4;
  bVar2 = true;
  if ((uVar4 & 0xff) <= (uVar3 & 0xff)) {
    bVar2 = 0x10 < (int)(((uVar3 & 0xff) - (uVar4 & 0xff)) + 1);
  }
  if (bVar2) {
    gen_program_exception(s,6);
    s_local._4_4_ = DISAS_NORETURN;
  }
  else {
    arg3 = tcg_const_i64_s390x(tcg_ctx_00,
                               (long)(int)((((uVar3 & 0xff) - (uVar4 & 0xff)) + 1) * 0x10));
    gen_helper_probe_write_access(tcg_ctx_00,tcg_ctx_00->cpu_env,o->addr1,arg3);
    while( true ) {
      read_vec_element_i64(tcg_ctx_00,arg3,tmp._6_1_,'\0',MO_64);
      pTVar1 = o->addr1;
      iVar5 = get_mem_index(s);
      tcg_gen_qemu_st_i64_s390x(tcg_ctx_00,arg3,pTVar1,(long)iVar5,MO_BEQ);
      gen_addi_and_wrap_i64(s,o->addr1,o->addr1,8);
      read_vec_element_i64(tcg_ctx_00,arg3,tmp._6_1_,'\x01',MO_64);
      pTVar1 = o->addr1;
      iVar5 = get_mem_index(s);
      tcg_gen_qemu_st_i64_s390x(tcg_ctx_00,arg3,pTVar1,(long)iVar5,MO_BEQ);
      if (tmp._6_1_ == (uint8_t)uVar3) break;
      gen_addi_and_wrap_i64(s,o->addr1,o->addr1,8);
      tmp._6_1_ = tmp._6_1_ + '\x01';
    }
    tcg_temp_free_i64(tcg_ctx_00,arg3);
    s_local._4_4_ = DISAS_NEXT;
  }
  return s_local._4_4_;
}

Assistant:

static DisasJumpType op_vstm(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    const uint8_t v3 = get_field(s, v3);
    uint8_t v1 = get_field(s, v1);
    TCGv_i64 tmp;

    while (v3 < v1 || (v3 - v1 + 1) > 16) {
        gen_program_exception(s, PGM_SPECIFICATION);
        return DISAS_NORETURN;
    }

    /* Probe write access before actually modifying memory */
    tmp = tcg_const_i64(tcg_ctx, (v3 - v1 + 1) * 16);
    gen_helper_probe_write_access(tcg_ctx, tcg_ctx->cpu_env, o->addr1, tmp);

    for (;; v1++) {
        read_vec_element_i64(tcg_ctx, tmp, v1, 0, ES_64);
        tcg_gen_qemu_st_i64(tcg_ctx, tmp, o->addr1, get_mem_index(s), MO_TEQ);
        gen_addi_and_wrap_i64(s, o->addr1, o->addr1, 8);
        read_vec_element_i64(tcg_ctx, tmp, v1, 1, ES_64);
        tcg_gen_qemu_st_i64(tcg_ctx, tmp, o->addr1, get_mem_index(s), MO_TEQ);
        if (v1 == v3) {
            break;
        }
        gen_addi_and_wrap_i64(s, o->addr1, o->addr1, 8);
    }
    tcg_temp_free_i64(tcg_ctx, tmp);
    return DISAS_NEXT;
}